

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1,_2,_0,_1>
     ::run(Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *lhs,
          Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false> *rhs)

{
  long lVar1;
  Index size;
  float *pfVar2;
  size_t size_00;
  undefined8 rhs_00;
  BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true> *this;
  ulong uVar3;
  Index IVar4;
  Index lhsStride;
  undefined1 *puVar5;
  undefined1 local_118 [8];
  ScalarWithConstIfNotLvalue local_110 [2];
  Index local_108;
  float *local_100;
  float *local_e0;
  size_t local_d8;
  float *local_d0;
  ScalarWithConstIfNotLvalue *local_c8;
  ScalarWithConstIfNotLvalue *local_c0;
  ScalarWithConstIfNotLvalue *local_b8;
  ScalarWithConstIfNotLvalue *local_b0;
  ScalarWithConstIfNotLvalue *local_a8;
  undefined1 local_50 [8];
  aligned_stack_memory_handler<float> actualRhs_stack_memory_destructor;
  RhsScalar *actualRhs;
  bool useRhsDirectly;
  ActualLhsType actualLhs;
  Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false> *rhs_local;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *lhs_local;
  
  puVar5 = local_118;
  this = (BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true> *)
         blas_traits<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
         extract(lhs);
  uVar3 = EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)rhs);
  if (0x3fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  local_a8 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::data
                       ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                         *)rhs);
  if (local_a8 == (ScalarWithConstIfNotLvalue *)0x0) {
    IVar4 = EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::size
                      ((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)rhs);
    if ((ulong)(IVar4 * 4) < 0x20001) {
      IVar4 = EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::size
                        ((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)rhs);
      lVar1 = -(IVar4 * 4 + 0x1eU & 0xfffffffffffffff0);
      puVar5 = local_118 + lVar1;
      local_c0 = (ScalarWithConstIfNotLvalue *)((long)local_110 + lVar1);
    }
    else {
      IVar4 = EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::size
                        ((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)rhs);
      local_c0 = (ScalarWithConstIfNotLvalue *)aligned_malloc(IVar4 << 2);
    }
    local_b8 = local_c0;
  }
  else {
    local_b8 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::data
                         ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                           *)rhs);
    puVar5 = local_118;
    local_b0 = local_b8;
  }
  actualRhs_stack_memory_destructor._16_8_ = local_b8;
  *(undefined8 *)(puVar5 + -8) = 0x2653c5;
  local_c8 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::data
                       ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                         *)rhs);
  if (local_c8 == (ScalarWithConstIfNotLvalue *)0x0) {
    local_d0 = (float *)actualRhs_stack_memory_destructor._16_8_;
  }
  else {
    local_d0 = (float *)0x0;
  }
  local_e0 = local_d0;
  *(undefined8 *)(puVar5 + -8) = 0x265415;
  local_d8 = EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::size
                       ((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)rhs);
  *(undefined8 *)(puVar5 + -8) = 0x265425;
  IVar4 = EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)rhs);
  size_00 = local_d8;
  pfVar2 = local_e0;
  *(undefined8 *)(puVar5 + -8) = 0x26544f;
  aligned_stack_memory_handler<float>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_50,pfVar2,size_00,
             0x20000 < (ulong)(IVar4 * 4));
  *(undefined8 *)(puVar5 + -8) = 0x2654d6;
  local_108 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>
              ::cols((MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      *)this);
  *(undefined8 *)(puVar5 + -8) = 0x2654e6;
  local_100 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>
              ::data((MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      *)this);
  *(undefined8 *)(puVar5 + -8) = 0x2654f6;
  lhsStride = BlockImpl_dense<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
              outerStride(this);
  rhs_00 = actualRhs_stack_memory_destructor._16_8_;
  pfVar2 = local_100;
  size = local_108;
  *(undefined8 *)(puVar5 + -8) = 0x265510;
  triangular_solve_vector<float,_float,_long,_1,_2,_false,_0>::run
            (size,pfVar2,lhsStride,(float *)rhs_00);
  *(undefined8 *)(puVar5 + -8) = 0x265581;
  aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_50);
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC void run(const Lhs& lhs, Rhs& rhs)
  {
    ActualLhsType actualLhs = LhsProductTraits::extract(lhs);

    // FIXME find a way to allow an inner stride if packet_traits<Scalar>::size==1

    bool useRhsDirectly = Rhs::InnerStrideAtCompileTime==1 || rhs.innerStride()==1;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhs,rhs.size(),
                                                  (useRhsDirectly ? rhs.data() : 0));

    if(!useRhsDirectly)
      MappedRhs(actualRhs,rhs.size()) = rhs;

    triangular_solve_vector<LhsScalar, RhsScalar, Index, Side, Mode, LhsProductTraits::NeedToConjugate,
                            (int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor>
      ::run(actualLhs.cols(), actualLhs.data(), actualLhs.outerStride(), actualRhs);

    if(!useRhsDirectly)
      rhs = MappedRhs(actualRhs, rhs.size());
  }